

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::utp_socket_impl::incoming_packet
          (utp_socket_impl *this,span<const_char> b,endpoint *ep,time_point receive_time)

{
  ushort uVar1;
  undefined2 uVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  int iVar8;
  state_t sVar9;
  uint uVar10;
  uint32_t uVar11;
  uchar *puVar12;
  index_type iVar13;
  int64_t iVar14;
  int *piVar15;
  reference pvVar16;
  size_type sVar17;
  pointer ppVar18;
  uchar *puVar19;
  uint *puVar20;
  long lVar21;
  iterator __first;
  iterator __last;
  uint32_t local_1f0;
  bool local_1d1;
  uint32_t local_1d0;
  uint32_t prev_out_packets;
  bool has_ack;
  address local_1a0;
  error_code local_180;
  int local_170;
  int local_16c;
  int payload_size;
  int header_size;
  packet *local_160;
  packet *p_1;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  duration local_148;
  tuple<unsigned_int&,int&> local_140 [16];
  utp_socket_impl *local_130;
  pair<unsigned_int,_int> local_128;
  uint local_120;
  uint local_11c;
  uint32_t rtt_1;
  int len;
  uint8_t next_extension;
  uint8_t extension;
  uchar *puStack_110;
  int size;
  uint8_t *ptr;
  utp_socket_impl *local_f8;
  unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> local_f0;
  uint32_t local_e8 [2];
  uint32_t rtt;
  packet_ptr p;
  int ack_nr;
  int next_ack_nr;
  uint32_t min_rtt;
  int prev_bytes_in_flight;
  int acked_bytes;
  uint32_t delay;
  uint32_t sample;
  int local_b0;
  uint16_t local_ac;
  bool local_a9;
  uint32_t max_packets_reorder;
  uint16_t cmp_seq_nr;
  bool state_or_fin;
  int base_change;
  uint32_t prev_base;
  int local_94;
  uint local_90;
  uint32_t timestamp;
  uint32_t their_delay;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  byte local_71;
  undefined1 local_70 [7];
  bool step;
  utp_header *local_50;
  utp_header *ph;
  span<const_unsigned_char> buf;
  endpoint *ep_local;
  utp_socket_impl *this_local;
  time_point receive_time_local;
  span<const_char> b_local;
  
  receive_time_local.__d.__r = (duration)b.m_ptr;
  buf.m_len = (difference_type)ep;
  this_local = (utp_socket_impl *)receive_time.__d.__r;
  puVar12 = (uchar *)span<const_char>::data((span<const_char> *)&receive_time_local);
  iVar13 = span<const_char>::size((span<const_char> *)&receive_time_local);
  span<const_unsigned_char>::span((span<const_unsigned_char> *)&ph,puVar12,iVar13);
  local_50 = (utp_header *)span<const_unsigned_char>::data((span<const_unsigned_char> *)&ph);
  utp_socket_manager::inc_stats_counter(this->m_sm,0xa5,1);
  iVar13 = span<const_unsigned_char>::size((span<const_unsigned_char> *)&ph);
  if (iVar13 < 0x14) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  iVar8 = utp_header::get_version(local_50);
  if (iVar8 != 1) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  iVar8 = utp_header::get_type(local_50);
  if ((iVar8 != 4) &&
     (uVar6 = big_endian_int::operator_cast_to_unsigned_short
                        ((big_endian_int *)&local_50->connection_id), uVar6 != this->m_recv_id)) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  iVar8 = utp_header::get_type(local_50);
  if (4 < iVar8) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  sVar9 = state(this);
  if ((sVar9 == none) && (iVar8 = utp_header::get_type(local_50), iVar8 == 4)) {
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
              ((address *)local_70,(basic_endpoint<boost::asio::ip::udp> *)buf.m_len);
    boost::asio::ip::address::operator=(&this->m_remote_address,(address *)local_70);
    uVar6 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port
                      ((basic_endpoint<boost::asio::ip::udp> *)buf.m_len);
    this->m_port = uVar6;
  }
  sVar9 = state(this);
  if ((sVar9 != none) && (iVar8 = utp_header::get_type(local_50), iVar8 == 4)) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return true;
  }
  local_71 = 0;
  local_80.__r = (rep)::std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&this_local,&this->m_last_history_step);
  timestamp = 1;
  ::std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,std::ratio<60l,1l>> *)&their_delay,(int *)&timestamp);
  bVar3 = ::std::chrono::operator>(&local_80,(duration<long,_std::ratio<60L,_1L>_> *)&their_delay);
  if (bVar3) {
    local_71 = 1;
    (this->m_last_history_step).__d.__r = (rep)this_local;
  }
  local_90 = 0;
  uVar10 = big_endian_int::operator_cast_to_unsigned_int
                     ((big_endian_int *)&local_50->timestamp_microseconds);
  if (uVar10 != 0) {
    _base_change = ::std::chrono::
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&this_local);
    iVar14 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)_base_change);
    local_94 = (int)iVar14;
    uVar10 = big_endian_int::operator_cast_to_unsigned_int
                       ((big_endian_int *)&local_50->timestamp_microseconds);
    this->m_reply_micro = (int)iVar14 - uVar10;
    bVar3 = timestamp_history::initialized(&this->m_their_delay_hist);
    if (bVar3) {
      local_1d0 = timestamp_history::base(&this->m_their_delay_hist);
    }
    else {
      local_1d0 = 0;
    }
    _cmp_seq_nr = local_1d0;
    local_90 = timestamp_history::add_sample
                         (&this->m_their_delay_hist,this->m_reply_micro,(bool)(local_71 & 1));
    uVar11 = timestamp_history::base(&this->m_their_delay_hist);
    max_packets_reorder = uVar11 - _cmp_seq_nr;
    if ((((_cmp_seq_nr != 0) && ((int)max_packets_reorder < 0)) &&
        (-10000 < (int)max_packets_reorder)) &&
       (bVar3 = timestamp_history::initialized(&this->m_delay_hist), bVar3)) {
      timestamp_history::adjust_base(&this->m_delay_hist,-max_packets_reorder);
    }
  }
  iVar8 = utp_header::get_type(local_50);
  local_1d1 = true;
  if (iVar8 != 2) {
    iVar8 = utp_header::get_type(local_50);
    local_1d1 = iVar8 == 1;
  }
  local_a9 = local_1d1;
  sVar9 = state(this);
  if ((((sVar9 == syn_sent) || (sVar9 = state(this), sVar9 == fin_sent)) ||
      (sVar9 = state(this), sVar9 == deleting)) && ((local_a9 & 1U) != 0)) {
    local_ac = this->m_seq_nr;
  }
  else {
    local_ac = this->m_seq_nr - 1;
  }
  sVar9 = state(this);
  if ((sVar9 == none) && (iVar8 = utp_header::get_type(local_50), iVar8 == 4)) {
LAB_0079eaa8:
    if ((*(ushort *)&this->field_0x21c >> 5 & 1) != 0) {
      uVar1 = this->m_in_eof_seq_nr;
      uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->seq_nr);
      bVar3 = compare_less_wrap((uint)uVar1,(uint)uVar6,0xffff);
      if ((bVar3) &&
         ((uVar6 = this->m_in_eof_seq_nr,
          uVar7 = big_endian_int::operator_cast_to_unsigned_short
                            ((big_endian_int *)&local_50->seq_nr), uVar6 != uVar7 ||
          ((local_a9 & 1U) == 0)))) {
        return true;
      }
    }
    iVar8 = utp_header::get_type(local_50);
    if (iVar8 == 0) {
      utp_socket_manager::inc_stats_counter(this->m_sm,0xab,1);
    }
    sample = 0x10;
    delay = this->m_receive_buffer_capacity / 0x44c;
    piVar15 = ::std::max<int>((int *)&sample,(int *)&delay);
    local_b0 = *piVar15;
    sVar9 = state(this);
    if ((sVar9 != none) && (sVar9 = state(this), sVar9 != syn_sent)) {
      uVar10 = (uint)this->m_ack_nr + local_b0;
      uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->seq_nr);
      bVar3 = compare_less_wrap(uVar10 & 0xffff,(uint)uVar6,0xffff);
      if (bVar3) {
        utp_socket_manager::inc_stats_counter(this->m_sm,0xae,1);
        return true;
      }
    }
    iVar8 = utp_header::get_type(local_50);
    if (iVar8 == 3) {
      uVar10 = (uint)local_ac;
      uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr);
      bVar3 = compare_less_wrap(uVar10,(uint)uVar6,0xffff);
      if (bVar3) {
        return true;
      }
      boost::system::error_code::operator=(&this->m_error,connection_reset);
      set_state(this,error_wait);
      test_socket_state(this);
      return true;
    }
    this->m_in_packets = this->m_in_packets + 1;
    uVar10 = big_endian_int::operator_cast_to_unsigned_int
                       ((big_endian_int *)&local_50->timestamp_difference_microseconds);
    if (uVar10 == 0x7fffffff) {
      local_1f0 = 0;
    }
    else {
      local_1f0 = big_endian_int::operator_cast_to_unsigned_int
                            ((big_endian_int *)&local_50->timestamp_difference_microseconds);
    }
    acked_bytes = local_1f0;
    prev_bytes_in_flight = 0;
    if (local_1f0 != 0) {
      uVar11 = timestamp_history::add_sample(&this->m_delay_hist,local_1f0,(bool)(local_71 & 1));
      bVar4 = (byte)*(undefined2 *)&this->field_0x21c & 3;
      *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xfffc | (byte)(bVar4 + 1) & 3
      ;
      prev_bytes_in_flight = uVar11;
      pvVar16 = ::std::array<unsigned_int,_3UL>::operator[](&this->m_delay_sample_hist,(ulong)bVar4)
      ;
      *pvVar16 = uVar11;
      uVar2 = *(undefined2 *)&this->field_0x21c;
      sVar17 = ::std::array<unsigned_int,_3UL>::size(&this->m_delay_sample_hist);
      if (sVar17 <= ((byte)uVar2 & 3)) {
        *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xfffc;
      }
    }
    min_rtt = 0;
    next_ack_nr = this->m_bytes_in_flight;
    uVar10 = big_endian_int::operator_cast_to_unsigned_int((big_endian_int *)&local_50->wnd_size);
    this->m_adv_wnd = uVar10;
    uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr);
    if (((uVar6 == this->m_acked_seq_nr) &&
        (iVar8 = packet_buffer::size(&this->m_outbuf), iVar8 != 0)) &&
       (iVar8 = utp_header::get_type(local_50), iVar8 == 2)) {
      this->m_duplicate_acks = this->m_duplicate_acks + '\x01';
    }
    ack_nr = ::std::numeric_limits<unsigned_int>::max();
    sVar9 = state(this);
    if (sVar9 != none) {
      uVar1 = this->m_acked_seq_nr;
      uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr);
      bVar3 = compare_less_wrap((uint)uVar1,(uint)uVar6,0xffff);
      if (bVar3) {
        uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr)
        ;
        p._M_t.super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
        super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_ =
             (uint)this->m_acked_seq_nr;
        while (p._M_t.
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_ =
                    p._M_t.
                    super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
                    _M_t.
                    super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>
                    .super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_ + 1
                    & 0xffff,
              p._M_t.super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
              super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_ !=
              (uVar6 + 1 & 0xffff)) {
          if (this->m_fast_resend_seq_nr ==
              p._M_t.super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
              super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_) {
            this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
          }
          numeric_cast<unsigned_int,int,void>
                    (p._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>
                     .super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl._4_4_);
          packet_buffer::remove((packet_buffer *)&rtt,(char *)&this->m_outbuf);
          bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&rtt);
          if (bVar3) {
            ppVar18 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                      operator->((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
                                  *)&rtt);
            uVar1 = ppVar18->size;
            ppVar18 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                      operator->((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
                                  *)&rtt);
            min_rtt = min_rtt + ((uint)uVar1 - (uint)ppVar18->header_size);
            ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::unique_ptr
                      (&local_f0,
                       (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)&rtt)
            ;
            local_f8 = this_local;
            uVar11 = ack_packet(this,&local_f0,(time_point)this_local,
                                p._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>
                                .super__Head_base<0UL,_libtorrent::aux::packet_*,_false>.
                                _M_head_impl._4_2_);
            ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::~unique_ptr
                      (&local_f0);
            local_e8[0] = uVar11;
            puVar20 = ::std::min<unsigned_int>((uint *)&ack_nr,local_e8);
            ack_nr = *puVar20;
            local_e8[1] = 0;
          }
          else {
            local_e8[1] = 0x22;
          }
          ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::~unique_ptr
                    ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)&rtt);
        }
        maybe_inc_acked_seq_nr(this);
        bVar3 = packet_buffer::empty(&this->m_outbuf);
        if (bVar3) {
          this->m_duplicate_acks = '\0';
        }
      }
    }
    puStack_110 = span<const_unsigned_char>::data((span<const_unsigned_char> *)&ph);
    iVar13 = span<const_unsigned_char>::size((span<const_unsigned_char> *)&ph);
    len = (int)iVar13;
    puStack_110 = puStack_110 + 0x14;
    rtt_1._3_1_ = local_50->extension;
    do {
      puVar12 = puStack_110;
      if (rtt_1._3_1_ == '\0') {
        this->m_num_timeouts = '\0';
        p_1._4_4_ = packet_timeout(this);
        ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_150,(int *)((long)&p_1 + 4));
        local_148.__r =
             (rep)::std::chrono::operator+
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&this_local,&local_150);
        (this->m_timeout).__d.__r = local_148.__r;
        if ((2 < this->m_duplicate_acks) &&
           ((uint16_t)(this->m_acked_seq_nr + 1) == this->m_fast_resend_seq_nr)) {
          local_160 = packet_buffer::at(&this->m_outbuf,(uint)this->m_fast_resend_seq_nr);
          this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
          if (local_160 != (packet *)0x0) {
            if (-1 < (char)local_160->field_0xe) {
              _payload_size = this_local;
              experienced_loss(this,(uint)this->m_fast_resend_seq_nr,(time_point)this_local);
            }
            resend_packet(this,local_160,true);
          }
        }
        puVar12 = puStack_110;
        puVar19 = span<const_unsigned_char>::data((span<const_unsigned_char> *)&ph);
        local_16c = (int)puVar12 - (int)puVar19;
        local_170 = len - local_16c;
        iVar8 = utp_header::get_type(local_50);
        if (iVar8 == 1) {
          uVar6 = big_endian_int::operator_cast_to_unsigned_short
                            ((big_endian_int *)&local_50->seq_nr);
          if ((uVar6 == (unsigned_short)(this->m_ack_nr + 1)) ||
             (uVar6 = big_endian_int::operator_cast_to_unsigned_short
                                ((big_endian_int *)&local_50->seq_nr), uVar6 == this->m_ack_nr)) {
            uVar6 = big_endian_int::operator_cast_to_unsigned_short
                              ((big_endian_int *)&local_50->seq_nr);
            this->m_ack_nr = uVar6;
          }
          if ((*(ushort *)&this->field_0x21c >> 5 & 1) == 0) {
            *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xffdf | 0x20;
            if (local_170 < 1) {
              uVar6 = big_endian_int::operator_cast_to_unsigned_short
                                ((big_endian_int *)&local_50->seq_nr);
              this->m_in_eof_seq_nr = uVar6;
            }
            else {
              uVar6 = big_endian_int::operator_cast_to_unsigned_short
                                ((big_endian_int *)&local_50->seq_nr);
              this->m_in_eof_seq_nr = uVar6 + 1;
            }
          }
          defer_ack(this);
          if ((this->m_ack_nr == this->m_in_eof_seq_nr) &&
             (bVar3 = ::std::
                      vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
                      ::empty(&this->m_receive_buffer), bVar3)) {
            boost::system::error_code::error_code<boost::asio::error::misc_errors>
                      (&local_180,eof,(type *)0x0);
            maybe_trigger_receive_callback(this,&local_180);
          }
          return true;
        }
        sVar9 = state(this);
        if ((sVar9 == error_wait) || (sVar9 = state(this), sVar9 == deleting)) {
          return true;
        }
        sVar9 = state(this);
        switch(sVar9) {
        case none:
          iVar8 = utp_header::get_type(local_50);
          if (iVar8 == 4) {
            set_state(this,connected);
            boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
                      (&local_1a0,(basic_endpoint<boost::asio::ip::udp> *)buf.m_len);
            boost::asio::ip::address::operator=(&this->m_remote_address,&local_1a0);
            uVar6 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port
                              ((basic_endpoint<boost::asio::ip::udp> *)buf.m_len);
            this->m_port = uVar6;
            uVar6 = big_endian_int::operator_cast_to_unsigned_short
                              ((big_endian_int *)&local_50->seq_nr);
            this->m_ack_nr = uVar6;
            lVar21 = random((aux *)0xffff);
            this->m_seq_nr = (uint16_t)lVar21;
            this->m_acked_seq_nr = this->m_seq_nr - 1;
            this->m_loss_seq_nr = this->m_acked_seq_nr;
            this->m_fast_resend_seq_nr = this->m_seq_nr;
            uVar6 = this->m_send_id;
            uVar7 = big_endian_int::operator_cast_to_unsigned_short
                              ((big_endian_int *)&local_50->connection_id);
            if (uVar6 != uVar7) {
              return false;
            }
            defer_ack(this);
          }
          break;
        case syn_sent:
          uVar6 = big_endian_int::operator_cast_to_unsigned_short
                            ((big_endian_int *)&local_50->ack_nr);
          if (uVar6 != (unsigned_short)(this->m_seq_nr - 1)) {
            return true;
          }
          set_state(this,connected);
          iVar8 = utp_header::get_type(local_50);
          if (iVar8 == 0) {
            uVar6 = big_endian_int::operator_cast_to_unsigned_short
                              ((big_endian_int *)&local_50->seq_nr);
            this->m_ack_nr = uVar6;
          }
          else {
            uVar6 = big_endian_int::operator_cast_to_unsigned_short
                              ((big_endian_int *)&local_50->seq_nr);
            this->m_ack_nr = uVar6 - 1;
          }
          if ((this->m_connect_handler & 1U) != 0) {
            this->m_connect_handler = false;
            utp_stream::on_connect(this->m_userdata,&this->m_error,false);
          }
        case connected:
          if (((acked_bytes != 0) && (min_rtt != 0)) && (next_ack_nr != 0)) {
            __first = ::std::array<unsigned_int,_3UL>::begin(&this->m_delay_sample_hist);
            __last = ::std::array<unsigned_int,_3UL>::end(&this->m_delay_sample_hist);
            puVar20 = ::std::min_element<unsigned_int*>(__first,__last);
            prev_bytes_in_flight = *puVar20;
            if ((uint)ack_nr < (uint)prev_bytes_in_flight) {
              prev_bytes_in_flight = ack_nr;
            }
            do_ledbat(this,min_rtt,prev_bytes_in_flight,next_ack_nr);
            this->m_send_delay = prev_bytes_in_flight;
          }
          puVar20 = ::std::min<unsigned_int>(&local_90,(uint *)&ack_nr);
          this->m_recv_delay = *puVar20;
          consume_incoming_data(this,local_50,puStack_110,local_170,(time_point)this_local);
          iVar8 = utp_header::get_type(local_50);
          bVar3 = true;
          if (iVar8 != 0) {
            iVar8 = utp_header::get_type(local_50);
            bVar3 = true;
            if (iVar8 != 1) {
              iVar8 = utp_header::get_type(local_50);
              bVar3 = iVar8 == 4;
            }
          }
          uVar11 = this->m_out_packets;
          iVar8 = utp_header::get_type(local_50);
          if (iVar8 != 4) {
            *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0x7fff | 0x8000;
          }
          do {
            bVar5 = send_pkt(this,0);
          } while (bVar5);
          if ((bVar3) && (uVar11 == this->m_out_packets)) {
            defer_ack(this);
          }
          subscribe_drained(this);
          sVar9 = state(this);
          if ((sVar9 == error_wait) || (sVar9 = state(this), sVar9 == deleting)) {
            return true;
          }
          if ((((*(ushort *)&this->field_0x21c >> 5 & 1) != 0) &&
              (this->m_ack_nr == (uint16_t)(this->m_in_eof_seq_nr - 1))) &&
             ((sVar9 = state(this), sVar9 == error_wait || (sVar9 = state(this), sVar9 == deleting))
             )) {
            return true;
          }
          break;
        case fin_sent:
          iVar8 = utp_header::get_type(local_50);
          if (iVar8 == 0) {
            defer_ack(this);
          }
          bVar3 = consume_incoming_data(this,local_50,puStack_110,local_170,(time_point)this_local);
          if ((!bVar3) && (this->m_acked_seq_nr == this->m_seq_nr)) {
            if ((*(ushort *)&this->field_0x21c >> 7 & 1) == 0) {
              boost::system::error_code::operator=(&this->m_error,eof);
              set_state(this,deleting);
              test_socket_state(this);
            }
            else {
              boost::system::error_code::operator=(&this->m_error,eof);
              set_state(this,error_wait);
              test_socket_state(this);
            }
          }
          break;
        case error_wait:
        case deleting:
          uVar6 = big_endian_int::operator_cast_to_unsigned_short
                            ((big_endian_int *)&local_50->seq_nr);
          send_reset(this,uVar6);
        }
        return true;
      }
      puVar19 = span<const_unsigned_char>::data((span<const_unsigned_char> *)&ph);
      if ((long)len < (long)(puVar12 + (2 - (long)puVar19))) {
        utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
        return true;
      }
      rtt_1._2_1_ = *puStack_110;
      puVar19 = puStack_110 + 2;
      local_11c = (uint)puStack_110[1];
      puStack_110 = puVar19;
      puVar12 = span<const_unsigned_char>::data((span<const_unsigned_char> *)&ph);
      if ((long)len < (long)(puVar19 + ((long)(int)local_11c - (long)puVar12))) {
        utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
        return true;
      }
      if (rtt_1._3_1_ == '\x01') {
        uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr)
        ;
        local_130 = this_local;
        local_128 = parse_sack(this,uVar6,puStack_110,local_11c,(time_point)this_local);
        ::std::tie<unsigned_int,int>((uint *)local_140,(int *)&local_120);
        ::std::tuple<unsigned_int&,int&>::operator=(local_140,&local_128);
        puVar20 = ::std::min<unsigned_int>((uint *)&ack_nr,&local_120);
        ack_nr = *puVar20;
      }
      else if (rtt_1._3_1_ == '\x03') {
        parse_close_reason(this,puStack_110,local_11c);
      }
      puStack_110 = puStack_110 + (int)local_11c;
      rtt_1._3_1_ = rtt_1._2_1_;
    } while( true );
  }
  uVar10 = (uint)local_ac;
  uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr);
  bVar3 = compare_less_wrap(uVar10,(uint)uVar6,0xffff);
  if (!bVar3) {
    uVar6 = big_endian_int::operator_cast_to_unsigned_short((big_endian_int *)&local_50->ack_nr);
    bVar3 = compare_less_wrap((uint)uVar6,this->m_acked_seq_nr - 3,0xffff);
    if (!bVar3) goto LAB_0079eaa8;
  }
  utp_socket_manager::inc_stats_counter(this->m_sm,0xae,1);
  return true;
}

Assistant:

bool utp_socket_impl::incoming_packet(span<char const> b
	, udp::endpoint const& ep, time_point receive_time)
{
	INVARIANT_CHECK;
	span<std::uint8_t const> const buf(reinterpret_cast<std::uint8_t const*>(b.data()), b.size());

	auto const* ph = reinterpret_cast<utp_header const*>(buf.data());
	m_sm.inc_stats_counter(counters::utp_packets_in);

	if (buf.size() < int(sizeof(utp_header)))
	{
		UTP_LOG("%8p: ERROR: incoming packet size too small:%d (ignored)\n"
			, static_cast<void*>(this), int(buf.size()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_version() != 1)
	{
		UTP_LOG("%8p: ERROR: incoming packet version:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_version()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	// SYN packets have special (reverse) connection ids
	if (ph->get_type() != ST_SYN && ph->connection_id != m_recv_id)
	{
		UTP_LOG("%8p: ERROR: incoming packet id:%d expected:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->connection_id), int(m_recv_id));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_type() >= NUM_TYPES)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_type()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (state() == state_t::none && ph->get_type() == ST_SYN)
	{
		m_remote_address = ep.address();
		m_port = ep.port();
	}

	if (state() != state_t::none && ph->get_type() == ST_SYN)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:ST_SYN (ignored)\n"
			, static_cast<void*>(this));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return true;
	}

	bool step = false;
	if (receive_time - m_last_history_step > minutes(1))
	{
		step = true;
		m_last_history_step = receive_time;
	}

	// this is the difference between their send time and our receive time
	// 0 means no sample yet
	std::uint32_t their_delay = 0;
	if (ph->timestamp_microseconds != 0)
	{
		auto timestamp = static_cast<std::uint32_t>(total_microseconds(
			receive_time.time_since_epoch()) & 0xffffffff);
		m_reply_micro = timestamp - ph->timestamp_microseconds;
		std::uint32_t const prev_base = m_their_delay_hist.initialized() ? m_their_delay_hist.base() : 0;
		their_delay = m_their_delay_hist.add_sample(m_reply_micro, step);
		int const base_change = int(m_their_delay_hist.base() - prev_base);
		UTP_LOGV("%8p: their_delay::add_sample:%u prev_base:%u new_base:%u\n"
			, static_cast<void*>(this), m_reply_micro, prev_base, m_their_delay_hist.base());

		if (prev_base && base_change < 0 && base_change > -10000 && m_delay_hist.initialized())
		{
			// their base delay went down. This is caused by clock drift. To compensate,
			// adjust our base delay upwards
			// don't adjust more than 10 ms. If the change is that big, something is probably wrong
			m_delay_hist.adjust_base(-base_change);
		}

		UTP_LOGV("%8p: incoming packet reply_micro:%u base_change:%d\n"
			, static_cast<void*>(this), m_reply_micro, prev_base ? base_change : 0);
	}

	bool const state_or_fin = ph->get_type() == ST_STATE
		|| ph->get_type() == ST_FIN;

	// is this ACK valid? If the other end is ACKing
	// a packet that hasn't been sent yet
	// just ignore it. A 3rd party could easily inject a packet
	// like this in a stream, don't sever it because of it.
	// since m_seq_nr is the sequence number of the next packet
	// we'll send (and m_seq_nr-1 was the last packet we sent),
	// if the ACK we got is greater than the last packet we sent
	// something is wrong.
	// If our state is state_none, this packet must be a syn packet
	// and the ack_nr should be ignored
	// Note that when we send a FIN, we don't increment m_seq_nr
	std::uint16_t const cmp_seq_nr =
		((state() == state_t::syn_sent
		  || state() == state_t::fin_sent
		  || state() == state_t::deleting)
			&& state_or_fin)
		? m_seq_nr : (m_seq_nr - 1) & ACK_MASK;

	if ((state() != state_t::none || ph->get_type() != ST_SYN)
		&& (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK)
			|| compare_less_wrap(ph->ack_nr, m_acked_seq_nr
				- dup_ack_limit, ACK_MASK)))
	{
		UTP_LOG("%8p: ERROR: incoming packet ack_nr:%d our seq_nr:%d our "
			"acked_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr, m_acked_seq_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	// if the socket is closing, always ignore any packet
	// with a higher sequence number than the FIN sequence number
	// ST_STATE messages always include the next seqnr, so it's acceptable to
	// receive the same seq_nr as the EOF as long as it's a STATE or FIN packet
	if (m_in_eof
		&& compare_less_wrap(m_in_eof_seq_nr, ph->seq_nr, ACK_MASK)
		&& !(m_in_eof_seq_nr == ph->seq_nr && state_or_fin))
	{
#if TORRENT_UTP_LOG
		UTP_LOG("%8p: ERROR: incoming payload after FIN type: %s seq_nr:%d eof_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), packet_type_names[ph->get_type()], int(ph->seq_nr), m_in_eof_seq_nr);
#endif
		return true;
	}

	if (ph->get_type() == ST_DATA)
		m_sm.inc_stats_counter(counters::utp_payload_pkts_in);

	// the number of packets that'll fit in the reorder buffer
	std::uint32_t const max_packets_reorder
		= static_cast<std::uint32_t>(std::max(16, m_receive_buffer_capacity / 1100));

	if (state() != state_t::none
		&& state() != state_t::syn_sent
		&& compare_less_wrap((m_ack_nr + max_packets_reorder) & ACK_MASK, ph->seq_nr, ACK_MASK))
	{
		// this is too far out to fit in our reorder buffer. Drop it
		// This is either an attack to try to break the connection
		// or a seriously damaged connection that lost a lot of
		// packets. Neither is very likely, and it should be OK
		// to drop the timestamp information.
		UTP_LOG("%8p: ERROR: incoming packet seq_nr:%d our ack_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->seq_nr), m_ack_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	if (ph->get_type() == ST_RESET)
	{
		if (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK))
		{
			UTP_LOG("%8p: ERROR: invalid RESET packet, ack_nr:%d our seq_nr:%d (ignored)\n"
				, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr);
			return true;
		}
		UTP_LOGV("%8p: incoming packet type:RESET\n", static_cast<void*>(this));
		m_error = boost::asio::error::connection_reset;
		set_state(state_t::error_wait);
		test_socket_state();
		return true;
	}

	++m_in_packets;

	// the test for INT_MAX here is a work-around for a bug in uTorrent where
	// it's sometimes sent as INT_MAX when it is in fact uninitialized
	const std::uint32_t sample = ph->timestamp_difference_microseconds == INT_MAX
		? 0 : ph->timestamp_difference_microseconds;

	std::uint32_t delay = 0;
	if (sample != 0)
	{
		delay = m_delay_hist.add_sample(sample, step);
		m_delay_sample_hist[m_delay_sample_idx++] = delay;
		if (m_delay_sample_idx >= m_delay_sample_hist.size())
			m_delay_sample_idx = 0;
	}

	int acked_bytes = 0;

	TORRENT_ASSERT(m_bytes_in_flight >= 0);
	int prev_bytes_in_flight = m_bytes_in_flight;

	m_adv_wnd = ph->wnd_size;

	// if we get an ack for the same sequence number as
	// was last ACKed, and we have outstanding packets,
	// it counts as a duplicate ack. The reason to not count ST_DATA packets as
	// duplicate ACKs is because we may be receiving a stream of those
	// regardless of our outgoing traffic, which makes their ACK number not
	// indicative of a dropped packet
	if (ph->ack_nr == m_acked_seq_nr
		&& m_outbuf.size()
		&& ph->get_type() == ST_STATE)
	{
		++m_duplicate_acks;
	}

	TORRENT_ASSERT_VAL(m_outbuf.size() > 0 || m_duplicate_acks == 0, m_duplicate_acks);

	std::uint32_t min_rtt = std::numeric_limits<std::uint32_t>::max();

	TORRENT_ASSERT(m_outbuf.at((m_acked_seq_nr + 1) & ACK_MASK) || ((m_seq_nr - m_acked_seq_nr) & ACK_MASK) <= 1);

	// has this packet already been ACKed?
	// if the ACK we just got is less than the max ACKed
	// sequence number, it doesn't tell us anything.
	// So, only act on it if the ACK is greater than the last acked
	// sequence number
	if (state() != state_t::none && compare_less_wrap(m_acked_seq_nr, ph->ack_nr, ACK_MASK))
	{
		int const next_ack_nr = ph->ack_nr;

		for (int ack_nr = (m_acked_seq_nr + 1) & ACK_MASK;
			ack_nr != ((next_ack_nr + 1) & ACK_MASK);
			ack_nr = (ack_nr + 1) & ACK_MASK)
		{
			if (m_fast_resend_seq_nr == ack_nr)
				m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;
			packet_ptr p = m_outbuf.remove(aux::numeric_cast<packet_buffer::index_type>(ack_nr));

			if (!p) continue;

			acked_bytes += p->size - p->header_size;
			std::uint32_t const rtt = ack_packet(std::move(p), receive_time, std::uint16_t(ack_nr));
			min_rtt = std::min(min_rtt, rtt);
		}

		maybe_inc_acked_seq_nr();
		if (m_outbuf.empty()) m_duplicate_acks = 0;
	}

	// look for extended headers
	std::uint8_t const* ptr = buf.data();
	int const size = int(buf.size());
	ptr += sizeof(utp_header);

	std::uint8_t extension = ph->extension;
	while (extension)
	{
		// invalid packet. It says it has an extension header
		// but the packet is too short
		if (ptr - buf.data() + 2 > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header\n", static_cast<void*>(this));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		std::uint8_t const next_extension = *ptr++;
		int const len = *ptr++;
		if (ptr - buf.data() + len > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header size:%d packet:%d\n"
				, static_cast<void*>(this), len, int(ptr - buf.data()));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		switch(extension)
		{
			case utp_sack: // selective ACKs
			{
				std::uint32_t rtt;
				std::tie(rtt, acked_bytes) = parse_sack(ph->ack_nr, ptr, len, receive_time);
				min_rtt = std::min(min_rtt, rtt);
				break;
			}
			case utp_close_reason:
				parse_close_reason(ptr, len);
				break;
		}
		ptr += len;
		extension = next_extension;
	}

	// this is a valid incoming packet, update the timeout timer
	// do this after processing sacks/acks as that can effect packet_timeout()
	m_num_timeouts = 0;
	m_timeout = receive_time + milliseconds(packet_timeout());
	UTP_LOGV("%8p: updating timeout to: now + %d\n"
		, static_cast<void*>(this), packet_timeout());

	if (m_duplicate_acks >= dup_ack_limit
		&& ((m_acked_seq_nr + 1) & ACK_MASK) == m_fast_resend_seq_nr)
	{
		// LOSS

		UTP_LOGV("%8p: Packet %d lost. (%d duplicate acks, trigger fast-resend)\n"
			, static_cast<void*>(this), m_fast_resend_seq_nr, m_duplicate_acks);

		// resend the lost packet
		packet* p = m_outbuf.at(m_fast_resend_seq_nr);
		TORRENT_ASSERT(p);

		// don't fast-resend this again
		m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;

		if (p)
		{
			// don't consider a lost probe as proper loss, it doesn't necessarily
			// signal congestion
			if (!p->mtu_probe) experienced_loss(m_fast_resend_seq_nr, receive_time);
			resend_packet(p, true);
		}
	}

	// ptr points to the payload of the packet
	// size is the packet size, payload is the
	// number of payload bytes are in this packet
	const int header_size = int(ptr - buf.data());
	const int payload_size = size - header_size;

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: incoming packet seq_nr:%d ack_nr:%d type:%s id:%d size:%d timestampdiff:%u timestamp:%u "
			"our ack_nr:%d our seq_nr:%d our acked_seq_nr:%d our state:%s\n"
		, static_cast<void*>(this), int(ph->seq_nr), int(ph->ack_nr), packet_type_names[ph->get_type()]
		, int(ph->connection_id), payload_size, std::uint32_t(ph->timestamp_difference_microseconds)
		, std::uint32_t(ph->timestamp_microseconds), m_ack_nr, m_seq_nr, m_acked_seq_nr, socket_state_names[m_state]);
#endif

	if (ph->get_type() == ST_FIN)
	{
		// We ignore duplicate FIN packets, but we still need to ACK them.
		if (ph->seq_nr == ((m_ack_nr + 1) & ACK_MASK)
			|| ph->seq_nr == m_ack_nr)
		{
			UTP_LOGV("%8p: FIN received in order\n", static_cast<void*>(this));

			// The FIN arrived in order, nothing else is in the
			// reorder buffer.
			m_ack_nr = ph->seq_nr;
		}
		else
		{
			UTP_LOGV("%8p: FIN received out-of-order\n", static_cast<void*>(this));
		}

		if (payload_size > 0)
		{
			UTP_LOGV("%8p: FIN packet carries payload, which is not allowed (%d bytes)\n"
				, static_cast<void*>(this), payload_size);
		}

		if (m_in_eof)
		{
			UTP_LOGV("%8p: duplicate FIN packet (not updating, m_in_eof_seq_nr=%d)\n"
				, static_cast<void*>(this), m_in_eof_seq_nr);
		}
		else
		{
			m_in_eof = true;
			// even though invalid, tolerate FIN packets with payload
			if (payload_size > 0)
				m_in_eof_seq_nr = (ph->seq_nr + 1) & ACK_MASK;
			else
				m_in_eof_seq_nr = ph->seq_nr;
			UTP_LOGV("%8p: in_eof_seq_nr=%d m_receive_buffer=%d\n"
				, static_cast<void*>(this), m_in_eof_seq_nr, int(m_receive_buffer.size()));
		}

		defer_ack();

		if (m_ack_nr == m_in_eof_seq_nr && m_receive_buffer.empty())
			maybe_trigger_receive_callback(boost::asio::error::eof);
		return true;
	}

	// the send operation in parse_sack() may have set the socket to an error
	// state, in which case we shouldn't continue
	if (state() == state_t::error_wait || state() == state_t::deleting) return true;

	switch (state())
	{
		case state_t::none:
		{
			if (ph->get_type() == ST_SYN)
			{
				// if we're in state_none, the only thing
				// we accept are SYN packets.
				set_state(state_t::connected);

				m_remote_address = ep.address();
				m_port = ep.port();

				m_ack_nr = ph->seq_nr;
				m_seq_nr = std::uint16_t(random(0xffff));
				m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
				m_loss_seq_nr = m_acked_seq_nr;
				m_fast_resend_seq_nr = m_seq_nr;

#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: received ST_SYN state:%s seq_nr:%d ack_nr:%d\n"
					, static_cast<void*>(this), socket_state_names[m_state], m_seq_nr, m_ack_nr);
#endif
				if (m_send_id != ph->connection_id)
				{
#if TORRENT_UTP_LOG
					UTP_LOGV("%8p: received invalid connection_id:%d expected: %d\n"
						, static_cast<void*>(this), int(ph->connection_id), int(m_send_id));
#endif
					return false;
				}
				TORRENT_ASSERT(m_recv_id == ((m_send_id + 1) & 0xffff));

				defer_ack();
			}
			else
			{
#if TORRENT_UTP_LOG
				UTP_LOG("%8p: ERROR: type:%s state:%s (ignored)\n"
					, static_cast<void*>(this), packet_type_names[ph->get_type()], socket_state_names[m_state]);
#endif
			}
			break;
		}
		case state_t::syn_sent:
		{
			// just wait for an ack to our SYN, ignore everything else
			if (ph->ack_nr != ((m_seq_nr - 1) & ACK_MASK))
			{
#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: incorrect ack_nr (%d) waiting for %d\n"
					, static_cast<void*>(this), int(ph->ack_nr), (m_seq_nr - 1) & ACK_MASK);
#endif
				break;
			}

			TORRENT_ASSERT(!m_error);
			set_state(state_t::connected);
#if TORRENT_UTP_LOG
			UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif

			// only progress our ack_nr on ST_DATA messages
			// since our m_ack_nr is uninitialized at this point
			// we still need to set it to something regardless
			if (ph->get_type() == ST_DATA)
				m_ack_nr = ph->seq_nr;
			else
				m_ack_nr = (ph->seq_nr - 1) & ACK_MASK;

			// notify the client that the socket connected
			if (m_connect_handler)
			{
				m_connect_handler = false;
				utp_stream::on_connect(m_userdata, m_error, false);
			}
			BOOST_FALLTHROUGH;
		}
		// fall through
		case state_t::connected:
		{
			// the lowest seen RTT can be used to clamp the delay
			// within reasonable bounds. The one-way delay is never
			// higher than the round-trip time.

			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				// only use the minimum from the last 3 delay measurements
				delay = *std::min_element(m_delay_sample_hist.begin()
					, m_delay_sample_hist.end());

				// it's impossible for delay to be more than the RTT, so make
				// sure to clamp it as a sanity check
				if (delay > min_rtt) delay = min_rtt;

				do_ledbat(acked_bytes, int(delay), prev_bytes_in_flight);
				m_send_delay = std::int32_t(delay);
			}

			m_recv_delay = std::int32_t(std::min(their_delay, min_rtt));

			consume_incoming_data(ph, ptr, payload_size, receive_time);

			// the parameter to send_pkt tells it if we're acking data
			// If we are, we'll send an ACK regardless of if we have any
			// space left in our send window or not. If we just got an ACK
			// (i.e. ST_STATE) we're not ACKing anything. If we just
			// received a FIN packet, we need to ack that as well
			bool const has_ack = ph->get_type() == ST_DATA
				|| ph->get_type() == ST_FIN
				|| ph->get_type() == ST_SYN;

			std::uint32_t prev_out_packets = m_out_packets;

			// the connection is connected and this packet made it past all the
			// checks. We can now assume the other end is not spoofing it's IP.
			if (ph->get_type() != ST_SYN) m_confirmed = true;

			// try to send more data as long as we can
			// if send_pkt returns true
			while (send_pkt());

			if (has_ack && prev_out_packets == m_out_packets)
			{
				// we need to ack some data we received, and we didn't
				// end up sending any payload packets in the loop
				// above (because m_out_packets would have been incremented
				// in that case). This means we need to send an ack.
				// don't do it right away, because we may still receive
				// more packets. defer the ack to send as few acks as possible
				defer_ack();
			}

			// we may want to call the user callback function at the end
			// of this round. Subscribe to that event
			subscribe_drained();

			if (state() == state_t::error_wait || state() == state_t::deleting) return true;

			// Everything up to the FIN has been received
			if (m_in_eof && m_ack_nr == ((m_in_eof_seq_nr - 1) & ACK_MASK))
			{
				UTP_LOGV("%8p: incoming stream at EOF\n", static_cast<void*>(this));
				if (state() == state_t::error_wait || state() == state_t::deleting) return true;
			}

			TORRENT_ASSERT(!compare_less_wrap(m_seq_nr, m_acked_seq_nr, ACK_MASK));

#if TORRENT_UTP_LOG
			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				char their_delay_base[20];
				if (m_their_delay_hist.initialized())
					std::snprintf(their_delay_base, sizeof(their_delay_base), "%u", m_their_delay_hist.base());
				else
					strcpy(their_delay_base, "-");

				char our_delay_base[20];
				if (m_delay_hist.initialized())
					std::snprintf(our_delay_base, sizeof(our_delay_base), "%u", m_delay_hist.base());
				else
					strcpy(our_delay_base, "-");

				UTP_LOG("%8p: "
					"actual_delay:%u "
					"our_delay:%f "
					"their_delay:%f "
					"off_target:%f "
					"max_window:%u "
					"upload_rate:%d "
					"delay_base:%s "
					"delay_sum:%f "
					"target_delay:%d "
					"acked_bytes:%d "
					"cur_window:%d "
					"scaled_gain:%f "
					"rtt:%u "
					"rate:%d "
					"quota:%d "
					"wnduser:%u "
					"rto:%d "
					"timeout:%d "
					"get_microseconds:%u "
					"cur_window_packets:%u "
					"packet_size:%d "
					"their_delay_base:%s "
					"their_actual_delay:%u "
					"seq_nr:%u "
					"acked_seq_nr:%u "
					"reply_micro:%u "
					"min_rtt:%u "
					"send_buffer:%d "
					"recv_buffer:%d "
					"fast_resend_seq_nr:%d "
					"ssthres:%d "
					"\n"
					, static_cast<void*>(this)
					, sample
					, delay / 1000.0
					, their_delay / 1000.0
					, int(m_sm.target_delay() - delay) / 1000.0
					, std::uint32_t(m_cwnd >> 16)
					, 0
					, our_delay_base
					, (delay + their_delay) / 1000.0
					, m_sm.target_delay() / 1000
					, acked_bytes
					, m_bytes_in_flight
					, 0.0 // float(scaled_gain)
					, m_rtt.mean()
					, int((m_cwnd * 1000 / (m_rtt.mean()?m_rtt.mean():50)) >> 16)
					, 0
					, m_adv_wnd
					, packet_timeout()
					, int(total_milliseconds(m_timeout - receive_time))
					, int(total_microseconds(receive_time.time_since_epoch()))
					, m_outbuf.size()
					, m_mtu
					, their_delay_base
					, std::uint32_t(m_reply_micro)
					, m_seq_nr
					, m_acked_seq_nr
					, m_reply_micro
					, min_rtt / 1000
					, m_write_buffer_size
					, m_read_buffer_size
					, m_fast_resend_seq_nr
					, m_ssthres);
			}
#endif

			break;
		}
		case state_t::fin_sent:
		{
			// There are two ways we can end up in this state:
			//
			// 1. If the socket has been explicitly closed on our
			//    side, in which case m_in_eof is false.
			//
			// 2. If we received a FIN from the remote side, in which
			//    case m_in_eof is true. If this is the case, we don't
			//    come here until everything up to the FIN has been
			//    received.
			//
			//
			//

			// At this point m_seq_nr - 1 is the FIN sequence number.

			// We can receive both ST_DATA and ST_STATE here, because after
			// we have closed our end of the socket, the remote end might
			// have data in the pipeline. We don't really care about the
			// data, but we do have to ack it. Or rather, we have to ack
			// the FIN that will come after the data.

			// Case 1:
			// ---------------------------------------------------------------
			//
			// If we are here because the local endpoint was closed, we need
			// to first wait for all of our messages to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			//                     ----------------------
			//
			// After that has happened we need to wait for the remote side
			// to send its ST_FIN message. When we receive that we send an
			// ST_STATE back to ack, and wait for a sufficient period.
			// During this wait we keep acking incoming ST_FIN's. This is
			// all handled at the top of this function.
			//
			// Note that the user handlers are all cancelled when the initial
			// close() call happens, so nothing will happen on the user side
			// after that.

			// Case 2:
			// ---------------------------------------------------------------
			//
			// If we are here because we received a ST_FIN message, and then
			// sent our own ST_FIN to ack that, we need to wait for our ST_FIN
			// to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			// After that has happened we know the remote side has all our
			// data, and we can gracefully shut down.

			// we should still ack any incoming data to prevent potential
			// timeouts/resends at the other end
			if (ph->get_type() == ST_DATA) defer_ack();

			if (consume_incoming_data(ph, ptr, payload_size, receive_time))
			{
				break;
			}

			// we don't increment m_seq_nr when sending a FIN, so we actually
			// need to wait for m_acked_sen_nr to reach m_seq_nr before the FIN
			// is considered ACKed
			if (m_acked_seq_nr == m_seq_nr)
			{
				// When this happens we know that the remote side has
				// received all of our packets.

				UTP_LOGV("%8p: FIN acked\n", static_cast<void*>(this));

				if (!m_attached)
				{
					UTP_LOGV("%8p: close initiated here, delete socket\n"
						, static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::deleting);
					test_socket_state();
				}
				else
				{
					UTP_LOGV("%8p: closing socket\n", static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::error_wait);
					test_socket_state();
				}
			}

			break;
		}
		case state_t::deleting:
		case state_t::error_wait:
		{
			// respond with a reset
			send_reset(ph->seq_nr);
			break;
		}
	}
	return true;
}